

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall
ON_TextureMapping::HasMatchingCachedTextureCoordinates
          (ON_TextureMapping *this,ON_Mesh *mesh,ON_Xform *mesh_xform)

{
  ON_TextureCoordinates *pOVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  
  iVar3 = (mesh->m_TC).m_count;
  bVar5 = 0 < iVar3;
  if (0 < iVar3) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      iVar3 = ON_Mesh::VertexCount(mesh);
      pOVar1 = (mesh->m_TC).m_a;
      if ((iVar3 == *(int *)((long)&(pOVar1->m_T).m_count + lVar6)) &&
         (bVar2 = HasMatchingTextureCoordinates
                            (this,(ON_MappingTag *)((pOVar1->m_tag).m_mapping_id.Data4 + lVar6 + -8)
                             ,mesh_xform), bVar2)) {
        return bVar5;
      }
      lVar7 = lVar7 + 1;
      lVar4 = (long)(mesh->m_TC).m_count;
      lVar6 = lVar6 + 0xb8;
      bVar5 = lVar7 < lVar4;
    } while (lVar7 < lVar4);
  }
  return bVar5;
}

Assistant:

bool ON_TextureMapping::HasMatchingCachedTextureCoordinates(
  const ON_Mesh& mesh,
  const ON_Xform* mesh_xform
) const
{
  bool rc = false;

  for (int i = 0; i < mesh.m_TC.Count(); i++)
  {
    if (mesh.VertexCount() == mesh.m_TC[i].m_T.Count() && HasMatchingTextureCoordinates(mesh.m_TC[i].m_tag, mesh_xform))
    {
      rc = true;
      break;
    }
  }

  return rc;
}